

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LSTMParams::SerializeWithCachedSizes
          (LSTMParams *this,CodedOutputStream *output)

{
  float value;
  
  if (this->sequenceoutput_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(10,true,output);
  }
  if (this->hasbiasvectors_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x14,true,output);
  }
  if (this->forgetbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x1e,true,output);
  }
  if (this->haspeepholevectors_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x28,true,output);
  }
  if (this->coupledinputandforgetgate_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,true,output);
  }
  value = this->cellclipthreshold_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(0x3c,value,output);
  return;
}

Assistant:

void LSTMParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LSTMParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool sequenceOutput = 10;
  if (this->sequenceoutput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->sequenceoutput(), output);
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->hasbiasvectors(), output);
  }

  // bool forgetBias = 30;
  if (this->forgetbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(30, this->forgetbias(), output);
  }

  // bool hasPeepholeVectors = 40;
  if (this->haspeepholevectors() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(40, this->haspeepholevectors(), output);
  }

  // bool coupledInputAndForgetGate = 50;
  if (this->coupledinputandforgetgate() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->coupledinputandforgetgate(), output);
  }

  // float cellClipThreshold = 60;
  if (this->cellclipthreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(60, this->cellclipthreshold(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LSTMParams)
}